

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O0

void Extra_TruthShrink(uint *pOut,uint *pIn,int nVars,int nVarsAll,uint Phase)

{
  uint *puVar1;
  bool bVar2;
  int local_3c;
  int Counter;
  int Var;
  int k;
  int i;
  uint *pTemp;
  uint Phase_local;
  int nVarsAll_local;
  int nVars_local;
  uint *pIn_local;
  uint *pOut_local;
  
  local_3c = 0;
  bVar2 = false;
  _nVarsAll_local = pIn;
  pIn_local = pOut;
  for (Var = 0; Var < nVarsAll; Var = Var + 1) {
    Counter = Var;
    if ((Phase & 1 << ((byte)Var & 0x1f)) != 0) {
      while (Counter = Counter + -1, local_3c <= Counter) {
        Extra_TruthSwapAdjacentVars(pIn_local,_nVarsAll_local,nVarsAll,Counter);
        puVar1 = pIn_local;
        pIn_local = _nVarsAll_local;
        bVar2 = (bool)(bVar2 ^ 1);
        _nVarsAll_local = puVar1;
      }
      local_3c = local_3c + 1;
    }
  }
  if (local_3c != nVars) {
    __assert_fail("Var == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilTruth.c"
                  ,0x11b,
                  "void Extra_TruthShrink(unsigned int *, unsigned int *, int, int, unsigned int)");
  }
  if (!bVar2) {
    Extra_TruthCopy(pIn_local,_nVarsAll_local,nVarsAll);
  }
  return;
}

Assistant:

void Extra_TruthShrink( unsigned * pOut, unsigned * pIn, int nVars, int nVarsAll, unsigned Phase )
{
    unsigned * pTemp;
    int i, k, Var = 0, Counter = 0;
    for ( i = 0; i < nVarsAll; i++ )
        if ( Phase & (1 << i) )
        {
            for ( k = i-1; k >= Var; k-- )
            {
                Extra_TruthSwapAdjacentVars( pOut, pIn, nVarsAll, k );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
                Counter++;
            }
            Var++;
        }
    assert( Var == nVars );
    // swap if it was moved an even number of times
    if ( !(Counter & 1) )
        Extra_TruthCopy( pOut, pIn, nVarsAll );
}